

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O1

void * remove_records(remove_records_args *args)

{
  long lVar1;
  int iVar2;
  spki_record *spki_record;
  long lVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  printf("Remove %i records: ASN [%i..%i]\n",(ulong)(uint)args->count,(ulong)(uint)args->start_asn,
         (ulong)((args->count - 1U) + args->start_asn));
  if (0 < args->count) {
    uVar4 = args->start_asn;
    do {
      spki_record = (spki_record *)malloc(0x80);
      spki_record->asn = uVar4;
      lVar3 = 0;
      do {
        spki_record->ski[lVar3] = (char)uVar4 + (char)lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x14);
      lVar3 = 0;
      do {
        spki_record->spki[lVar3] = (char)uVar4 + (char)lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x5b);
      spki_record->socket = (rtr_socket *)0x0;
      iVar2 = spki_table_remove_entry(args->table,spki_record);
      if (iVar2 != 0) {
        __assert_fail("ret == SPKI_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                      ,0x66,"void *remove_records(struct remove_records_args *)");
      }
      free(spki_record);
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < args->start_asn + args->count);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (void *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static void *remove_records(struct remove_records_args *args)
{
	printf("Remove %i records: ASN [%i..%i]\n", args->count, args->start_asn, args->count + args->start_asn - 1);
	for (int i = args->start_asn; i < args->count + args->start_asn; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);
		int ret = spki_table_remove_entry(args->table, record);

		assert(ret == SPKI_SUCCESS);
		free(record);
	}

	return NULL;
}